

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiWindow * ImGui::FindBottomMostVisibleWindowWithinBeginStack(ImGuiWindow *parent_window)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *pIVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  ImGuiWindow *pIVar6;
  ulong uVar7;
  
  pIVar4 = GImGui;
  uVar5 = FindWindowDisplayIndex(parent_window);
  pIVar6 = parent_window;
  if (-1 < (int)uVar5) {
    uVar7 = (ulong)uVar5;
    do {
      if ((pIVar4->Windows).Size <= (int)uVar5) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                      ,0x74f,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      pIVar1 = (pIVar4->Windows).Data[uVar7];
      bVar3 = false;
      if (((uint)pIVar1->Flags >> 0x18 & 1) == 0) {
        if (pIVar1->RootWindow == parent_window) {
LAB_0015e051:
          bVar3 = false;
          if (((pIVar1->Active == true) && (pIVar1->Hidden == false)) &&
             (((uint)pIVar1->Flags >> 0x19 & 1) <=
              (uint)(((uint)parent_window->Flags >> 0x19 & 1) != 0))) {
            pIVar6 = pIVar1;
            bVar3 = false;
          }
        }
        else {
          for (pIVar2 = pIVar1; bVar3 = true, pIVar2 != (ImGuiWindow *)0x0;
              pIVar2 = pIVar2->ParentWindowInBeginStack) {
            if (pIVar2 == parent_window) goto LAB_0015e051;
          }
        }
      }
    } while ((!bVar3) && (bVar3 = 0 < (long)uVar7, uVar7 = uVar7 - 1, bVar3));
  }
  return pIVar6;
}

Assistant:

ImGuiWindow* ImGui::FindBottomMostVisibleWindowWithinBeginStack(ImGuiWindow* parent_window)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* bottom_most_visible_window = parent_window;
    for (int i = FindWindowDisplayIndex(parent_window); i >= 0; i--)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_ChildWindow)
            continue;
        if (!IsWindowWithinBeginStackOf(window, parent_window))
            break;
        if (IsWindowActiveAndVisible(window) && GetWindowDisplayLayer(window) <= GetWindowDisplayLayer(parent_window))
            bottom_most_visible_window = window;
    }
    return bottom_most_visible_window;
}